

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_try_recv(amqp_connection_state_t state,uint64_t current_time)

{
  amqp_boolean_t aVar1;
  int iVar2;
  amqp_link_t *paVar3;
  amqp_connection_state_t in_RDI;
  amqp_link_t *link;
  amqp_frame_t *frame_copy;
  amqp_pool_t *channel_pool;
  int res;
  amqp_frame_t frame;
  timeval tv;
  void *in_stack_ffffffffffffff90;
  amqp_connection_state_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  timeval *in_stack_ffffffffffffffc8;
  uint64_t in_stack_ffffffffffffffd0;
  
  while( true ) {
    do {
      aVar1 = amqp_data_in_buffer(in_RDI);
      if (aVar1 == 0) {
        memset(&stack0xffffffffffffffd8,0,0x10);
        iVar2 = recv_with_timeout((amqp_connection_state_t)0x0,in_stack_ffffffffffffffd0,
                                  in_stack_ffffffffffffffc8);
        return iVar2;
      }
      in_stack_ffffffffffffffa4 =
           consume_one_frame((amqp_connection_state_t)
                             CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8),
                             (amqp_frame_t *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (in_stack_ffffffffffffffa4 != 0) {
        return in_stack_ffffffffffffffa4;
      }
    } while (in_stack_ffffffffffffffa8 == '\0');
    in_stack_ffffffffffffff98 =
         (amqp_connection_state_t)
         amqp_get_or_create_channel_pool
                   (in_stack_ffffffffffffff98,
                    (amqp_channel_t)((ulong)in_stack_ffffffffffffff90 >> 0x30));
    if (in_stack_ffffffffffffff98 == (amqp_connection_state_t)0x0) {
      return -1;
    }
    in_stack_ffffffffffffff90 =
         amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90)
    ;
    paVar3 = (amqp_link_t *)
             amqp_pool_alloc((amqp_pool_t *)in_stack_ffffffffffffff98,
                             (size_t)in_stack_ffffffffffffff90);
    if ((in_stack_ffffffffffffff90 == (void *)0x0) || (paVar3 == (amqp_link_t *)0x0)) break;
    memcpy(in_stack_ffffffffffffff90,&stack0xffffffffffffffa8,0x30);
    paVar3->next = (amqp_link_t_ *)0x0;
    paVar3->data = in_stack_ffffffffffffff90;
    if (in_RDI->last_queued_frame == (amqp_link_t *)0x0) {
      in_RDI->first_queued_frame = paVar3;
    }
    else {
      in_RDI->last_queued_frame->next = paVar3;
    }
    in_RDI->last_queued_frame = paVar3;
  }
  return -1;
}

Assistant:

int amqp_try_recv(amqp_connection_state_t state, uint64_t current_time)
{
  struct timeval tv;

  while (amqp_data_in_buffer(state)) {
    amqp_frame_t frame;
    int res = consume_one_frame(state, &frame);

    if (AMQP_STATUS_OK != res) {
      return res;
    }

    if (frame.frame_type != 0) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;
    }
  }

  memset(&tv, 0, sizeof(struct timeval));
  tv.tv_sec = 0;
  tv.tv_usec = 0;

  return recv_with_timeout(state, current_time, &tv);
}